

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylmat.cpp
# Opt level: O3

int __thiscall
TPZSkylMatrix<std::complex<double>_>::Decompose_LDLt(TPZSkylMatrix<std::complex<double>_> *this)

{
  undefined8 *puVar1;
  char cVar2;
  undefined8 *puVar3;
  complex<double> **ppcVar4;
  complex *pcVar5;
  bool bVar6;
  undefined8 uVar7;
  undefined1 auVar8 [16];
  double dVar9;
  complex *pcVar10;
  complex *pcVar11;
  int iVar12;
  int extraout_var;
  long lVar13;
  ostream *poVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  complex *pcVar18;
  complex<double> *__z;
  complex *pcVar19;
  double dVar20;
  double dVar21;
  TPZVec<std::complex<double>_> diag;
  double local_a8;
  double dStack_a0;
  long local_90;
  complex *local_88;
  long local_80;
  TPZVec<std::complex<double>_> local_78;
  complex<double> local_58;
  undefined1 local_48 [24];
  long size;
  
  cVar2 = (this->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fDecomposed;
  if (cVar2 != '\0') {
    if (cVar2 == '\x04') {
      return 1;
    }
    TPZMatrix<std::complex<double>_>::Error
              ("virtual int TPZSkylMatrix<std::complex<double>>::Decompose_LDLt() [TVar = std::complex<double>]"
               ,"Decompose_LDLt <Matrix already Decomposed with different decomposition>");
  }
  iVar12 = (*(this->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.super_TPZSavable.
             _vptr_TPZSavable[0xc])(this);
  size = CONCAT44(extraout_var,iVar12);
  TPZVec<std::complex<double>_>::TPZVec(&local_78,size);
  if (size != 0 && -1 < extraout_var) {
    lVar13 = 0;
    lVar15 = size;
    do {
      puVar3 = *(undefined8 **)((long)(this->fElem).fStore + lVar13);
      uVar7 = puVar3[1];
      puVar1 = (undefined8 *)((long)(local_78.fStore)->_M_value + lVar13 * 2);
      *puVar1 = *puVar3;
      puVar1[1] = uVar7;
      lVar13 = lVar13 + 8;
      lVar15 = lVar15 + -1;
    } while (lVar15 != 0);
    if (size != 1) {
      lVar15 = 1;
      do {
        ppcVar4 = (this->fElem).fStore;
        lVar13 = (long)ppcVar4[lVar15 + 1] - (long)ppcVar4[lVar15] >> 4;
        if (0 < lVar13) {
          lVar13 = (lVar15 - lVar13) + 1;
          local_80 = lVar15 << 4;
          lVar16 = lVar13;
          local_90 = lVar13;
          do {
            ppcVar4 = (this->fElem).fStore;
            pcVar5 = (complex *)ppcVar4[lVar16];
            lVar17 = (lVar16 - ((long)ppcVar4[lVar16 + 1] - (long)pcVar5 >> 4)) + 1;
            if (lVar17 < lVar13) {
              lVar17 = lVar13;
            }
            pcVar18 = (complex *)(ppcVar4[lVar15][-lVar17]._M_value + local_80);
            pcVar19 = pcVar5 + lVar17 * -0x10 + lVar16 * 0x10;
            __z = local_78.fStore + lVar17;
            dVar9 = 0.0;
            dVar20 = 0.0;
            pcVar10 = pcVar19;
            pcVar11 = local_88;
            for (; local_88 = pcVar5, lVar17 < lVar16; lVar17 = lVar17 + 1) {
              local_48._8_4_ = SUB84(dVar20,0);
              local_48._0_8_ = dVar9;
              local_48._12_4_ = (int)((ulong)dVar20 >> 0x20);
              local_58._M_value._0_8_ = *(undefined8 *)pcVar19;
              local_58._M_value._8_8_ = *(ulong *)(pcVar19 + 8) ^ 0x8000000000000000;
              local_a8 = *(double *)pcVar18;
              dStack_a0 = *(double *)(pcVar18 + 8);
              pcVar18 = pcVar18 + -0x10;
              std::complex<double>::operator*=((complex<double> *)&local_a8,&local_58);
              std::complex<double>::operator*=((complex<double> *)&local_a8,__z);
              dVar9 = (double)local_48._0_8_ + local_a8;
              dVar20 = (double)local_48._8_8_ + dStack_a0;
              __z = __z + 1;
              pcVar19 = pcVar19 + -0x10;
              pcVar5 = local_88;
              pcVar10 = local_88;
              lVar13 = local_90;
              pcVar11 = local_88;
            }
            dVar9 = *(double *)pcVar18 - dVar9;
            dVar20 = *(double *)(pcVar18 + 8) - dVar20;
            auVar8._8_4_ = SUB84(dVar20,0);
            auVar8._0_8_ = dVar9;
            auVar8._12_4_ = (int)((ulong)dVar20 >> 0x20);
            *(undefined1 (*) [16])pcVar18 = auVar8;
            local_88 = pcVar11;
            if (pcVar10 == pcVar18) {
              dVar9 = cabs(dVar9);
              uVar7 = *(undefined8 *)(pcVar18 + 8);
              *(undefined8 *)__z->_M_value = *(undefined8 *)pcVar18;
              *(undefined8 *)(__z->_M_value + 8) = uVar7;
              if (ABS(dVar9) < 1e-12) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"TPZSkylMatrix pivot = ",0x16);
                poVar14 = std::operator<<((ostream *)&std::cout,pcVar18);
                std::ios::widen((char)*(undefined8 *)(*(long *)poVar14 + -0x18) + (char)poVar14);
                std::ostream::put((char)poVar14);
                std::ostream::flush();
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"TPZSkylMatrix::DecomposeLDLt zero pivot\n",0x28);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"j = ",4);
                poVar14 = std::ostream::_M_insert<long>((long)&std::cout);
                std::__ostream_insert<char,std::char_traits<char>>(poVar14," l = ",5);
                poVar14 = std::ostream::_M_insert<long>((long)poVar14);
                std::ios::widen((char)*(undefined8 *)(*(long *)poVar14 + -0x18) + (char)poVar14);
                std::ostream::put((char)poVar14);
                std::ostream::flush();
              }
            }
            else {
              dVar21 = dVar20;
              uVar7 = __divdc3(SUB84(dVar9,0),SUB84(dVar20,0),*(undefined8 *)pcVar10,
                               *(undefined8 *)(pcVar10 + 8));
              *(undefined8 *)pcVar18 = uVar7;
              *(ulong *)(pcVar18 + 8) = CONCAT44((int)((ulong)dVar21 >> 0x20),SUB84(dVar20,0));
            }
            bVar6 = lVar16 < lVar15;
            lVar16 = lVar16 + 1;
          } while (bVar6);
        }
        lVar15 = lVar15 + 1;
      } while (lVar15 != size);
    }
  }
  (this->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fDecomposed = '\x04';
  (this->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fDefPositive = '\0';
  local_78._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01819178;
  if (local_78.fStore != (complex<double> *)0x0) {
    operator_delete__(local_78.fStore);
  }
  return 1;
}

Assistant:

int
TPZSkylMatrix<TVar>::Decompose_LDLt()
{
    
    if( this->fDecomposed == ELDLt) return 1;
    if (  this->fDecomposed )
        TPZMatrix<TVar>::Error(__PRETTY_FUNCTION__, "Decompose_LDLt <Matrix already Decomposed with different decomposition>" );
    
#ifdef DUMP_BEFORE_DECOMPOSE
    dump_matrix(this, "TPZSkylMatrix::Decompose_LDLt()");
#endif
    
    // Third try
    TVar *elj,*ell;
    int64_t j,l,minj,minl,minrow,dimension = this->Dim();
    TPZVec<TVar> diag(dimension);
    for(j=0; j<dimension; j++)
    {
        diag[j] = *fElem[j];
    }
    
    //std::cout << "TPZSkylMatrix<TVar>::Decompose_LDLt: dimension = " << dimension  << std::endl;
    
    TVar sum;
    j = 1;
    while(j < dimension) {
        /*    if(!(j%100) && Dim() > 100) {
         cout <<  j << ' ';
         cout.flush();
         }
         if(!(j%1000)) cout << endl;*/
        minj = j-Size(j)+1;
        l = minj;
        while(l <= j) {
            minl = l-Size(l)+1;
            minrow = (minj<minl)? minl:minj;
            int64_t k = minrow;
            //			DiagkPtr = fDiag+minrow;
            elj = fElem[j]+j-minrow;
            ell = fElem[l]+l-minrow;
            TVar *diagptr = &diag[k];
            sum = 0.;
            while(k < l) {
                //		  sum += *elj-- * *ell-- * *(fElem[k++]);
                //EBORIN: trocar *diagptr++ por *diagptr-- ajuda na vetorização?
                if constexpr(is_complex<TVar>::value){
                    sum += (*elj--) * std::conj(*ell--) * (*diagptr++);
                }else{
                    sum += (*elj--) * (*ell--) * (*diagptr++);
                }
                k++;
            }
            *elj -= sum;
            if(ell != elj) *elj /= *ell;
            else if(IsZero(*elj)) {
#ifdef PZ_LOG
                std::stringstream sout;
                sout << "col = " << j << " diagonal " << *elj;
                LOGPZ_DEBUG(logger,sout.str())
#endif
                
                *diagptr = *elj;
                cout << "TPZSkylMatrix pivot = " << *elj << endl;
                cout << "TPZSkylMatrix::DecomposeLDLt zero pivot\n";
                cout << "j = " << j << " l = " << l << endl;
            }
            else
            {
                *diagptr = *elj;
            }
            l++;
        }
        j++;
    }
    this->fDecomposed  = ELDLt;
    this->fDefPositive = 0;
    //if(Dim() > 100) cout << endl;
    return( 1 );
}